

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::AddDefinition(cmMakefile *this,string *name,char *value)

{
  cmake *pcVar1;
  bool bVar2;
  size_t sVar3;
  cmVariableWatch *this_00;
  string local_50;
  
  if (value != (char *)0x0) {
    bVar2 = cmStateSnapshot::IsInitialized(&this->StateSnapshot,name);
    if (bVar2) {
      LogUnused(this,"changing definition",name);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar3 = strlen(value);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,value,value + sVar3);
    cmStateSnapshot::SetDefinition(&this->StateSnapshot,name,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = this->GlobalGenerator->CMakeInstance;
    if (pcVar1 == (cmake *)0x0) {
      this_00 = (cmVariableWatch *)0x0;
    }
    else {
      this_00 = (pcVar1->VariableWatch)._M_t.
                super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>._M_t.
                super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>.
                super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl;
    }
    if (this_00 != (cmVariableWatch *)0x0) {
      cmVariableWatch::VariableAccessed(this_00,name,3,value,this);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefinition(const std::string& name, const char* value)
{
  if (!value) {
    return;
  }

  if (this->VariableInitialized(name)) {
    this->LogUnused("changing definition", name);
  }
  this->StateSnapshot.SetDefinition(name, value);

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv) {
    vv->VariableAccessed(name, cmVariableWatch::VARIABLE_MODIFIED_ACCESS,
                         value, this);
  }
#endif
}